

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

x86XmmReg __thiscall
CodeGenGenericContext::FindXmmRegAtMemory
          (CodeGenGenericContext *this,x86Size size,x86Reg index,int multiplier,x86Reg base,
          uint shift,bool checkRegisters)

{
  bool bVar1;
  uint uVar2;
  x86XmmReg local_58;
  uint i;
  uint memIndex;
  x86Argument newArg;
  x86Reg xStack_28;
  bool checkRegisters_local;
  uint shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  CodeGenGenericContext *this_local;
  
  newArg.ptrMult._3_1_ = checkRegisters;
  newArg.ptrNum = shift;
  xStack_28 = base;
  shift_local = multiplier;
  base_local = index;
  multiplier_local = size;
  _index_local = this;
  RedirectAddressComputation
            (this,&base_local,(int *)&shift_local,&stack0xffffffffffffffd8,(uint *)&newArg.ptrNum);
  x86Argument::x86Argument
            ((x86Argument *)&i,multiplier_local,base_local,shift_local,xStack_28,newArg.ptrNum);
  uVar2 = MemFind(this,(x86Argument *)&i);
  if ((uVar2 == 0) || (this->memCache[uVar2 - 1].value.type != argXmmReg)) {
    if ((newArg.ptrMult._3_1_ & 1) != 0) {
      for (local_58 = rXMM0; local_58 < rXmmRegCount; local_58 = local_58 + rXMM1) {
        if ((this->xmmReg[local_58].type == argPtr) &&
           (bVar1 = x86Argument::operator==(this->xmmReg + local_58,(x86Argument *)&i), bVar1)) {
          return local_58;
        }
      }
    }
    this_local._4_4_ = rXmmRegCount;
  }
  else {
    this_local._4_4_ = this->memCache[uVar2 - 1].value.field_1.xmmArg;
  }
  return this_local._4_4_;
}

Assistant:

x86XmmReg CodeGenGenericContext::FindXmmRegAtMemory(x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, bool checkRegisters)
{
#ifdef NULLC_OPTIMIZE_X86
	RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	if(unsigned memIndex = MemFind(newArg))
	{
		memIndex--;

		if(memCache[memIndex].value.type == x86Argument::argXmmReg)
			return memCache[memIndex].value.xmmArg;
	}

	if(checkRegisters)
	{
		// If another register contains data from memory
		for(unsigned i = 0; i < rXmmRegCount; i++)
		{
			if(xmmReg[i].type == x86Argument::argPtr && xmmReg[i] == newArg)
				return (x86XmmReg)i;
		}
	}
#endif

	return rXmmRegCount;
}